

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtplibraryversion.cpp
# Opt level: O0

string * __thiscall
jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_
          (string *__return_storage_ptr__,RTPLibraryVersion *this)

{
  allocator<char> local_29;
  char local_28 [8];
  char str [16];
  RTPLibraryVersion *this_local;
  
  str._8_8_ = this;
  snprintf(local_28,0x10,"%d.%d.%d",(ulong)(uint)this->majornr,(ulong)(uint)this->minornr,
           (ulong)(uint)this->debugnr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28,&local_29);
  std::allocator<char>::~allocator(&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string RTPLibraryVersion::GetVersionString() const
{
	char str[16];
	
	RTP_SNPRINTF(str,16,"%d.%d.%d",majornr,minornr,debugnr);
	
	return std::string(str);
}